

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_utils.cpp
# Opt level: O0

void crnlib::utils::endian_switch_dwords(uint32 *p,uint num)

{
  uint uVar1;
  uint32 k;
  uint32 *p_end;
  uint32 *puStack_18;
  uint num_local;
  uint32 *p_local;
  
  puStack_18 = p;
  while (puStack_18 != p + num) {
    uVar1 = *puStack_18;
    *puStack_18 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    puStack_18 = puStack_18 + 1;
  }
  return;
}

Assistant:

void endian_switch_dwords(uint32* p, uint num)
        {
            uint32* p_end = p + num;
            while (p != p_end)
            {
                uint32 k = *p;
                *p++ = swap32(k);
            }
        }